

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

uint32_t __thiscall spirv_cross::Compiler::expression_type_id(Compiler *this,uint32_t id)

{
  SPIRExpression *pSVar1;
  SPIRConstantOp *pSVar2;
  SPIRConstant *pSVar3;
  TypeID *pTVar4;
  CompilerError *this_00;
  
  switch((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[id].type) {
  case TypeVariable:
    pSVar3 = (SPIRConstant *)get<spirv_cross::SPIRVariable>(this,id);
    break;
  case TypeConstant:
    pSVar3 = get<spirv_cross::SPIRConstant>(this,id);
    break;
  default:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot resolve expression type.");
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case TypeExpression:
    pSVar1 = get<spirv_cross::SPIRExpression>(this,id);
    pTVar4 = &pSVar1->expression_type;
    goto LAB_00251ebb;
  case TypeConstantOp:
    pSVar2 = get<spirv_cross::SPIRConstantOp>(this,id);
    pTVar4 = &pSVar2->basetype;
    goto LAB_00251ebb;
  case TypeCombinedImageSampler:
    pSVar3 = (SPIRConstant *)get<spirv_cross::SPIRCombinedImageSampler>(this,id);
    break;
  case TypeAccessChain:
    pSVar3 = (SPIRConstant *)get<spirv_cross::SPIRAccessChain>(this,id);
    break;
  case TypeUndef:
    pSVar3 = (SPIRConstant *)get<spirv_cross::SPIRUndef>(this,id);
  }
  pTVar4 = (TypeID *)&(pSVar3->super_IVariant).field_0xc;
LAB_00251ebb:
  return pTVar4->id;
}

Assistant:

uint32_t Compiler::expression_type_id(uint32_t id) const
{
	switch (ir.ids[id].get_type())
	{
	case TypeVariable:
		return get<SPIRVariable>(id).basetype;

	case TypeExpression:
		return get<SPIRExpression>(id).expression_type;

	case TypeConstant:
		return get<SPIRConstant>(id).constant_type;

	case TypeConstantOp:
		return get<SPIRConstantOp>(id).basetype;

	case TypeUndef:
		return get<SPIRUndef>(id).basetype;

	case TypeCombinedImageSampler:
		return get<SPIRCombinedImageSampler>(id).combined_type;

	case TypeAccessChain:
		return get<SPIRAccessChain>(id).basetype;

	default:
		SPIRV_CROSS_THROW("Cannot resolve expression type.");
	}
}